

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionChamberElementType::~IfcDistributionChamberElementType
          (IfcDistributionChamberElementType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcDistributionFlowElementType).
                              super_IfcDistributionElementType.super_IfcElementType.
                              super_IfcTypeProduct.super_IfcTypeObject + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcDistributionFlowElementType).super_IfcDistributionElementType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 + lVar2);
  pvVar1 = &this->field_0x1c0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1c0) = 0x94ee90;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x94efd0;
  *(undefined8 *)((long)pvVar1 + -0x138) = 0x94eeb8;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x94eee0;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x94ef08;
  *(undefined8 *)((long)pvVar1 + -0x78) = 0x94ef30;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x94ef58;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x94ef80;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x94efa8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x94f430;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x70 = 0x94f4f8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x94f458;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x94f480;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x94f4a8;
  *(undefined8 *)&this_00->field_0x148 = 0x94f4d0;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__0094f000);
  return;
}

Assistant:

IfcDistributionChamberElementType() : Object("IfcDistributionChamberElementType") {}